

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void BuildAndStoreHuffmanTree
               (uint32_t *histogram,size_t histogram_length,size_t alphabet_size,HuffmanTree *tree,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t s4 [4];
  
  s4[2] = 0;
  s4[3] = 0;
  s4[0] = 0;
  s4[1] = 0;
  uVar12 = 0;
  for (sVar2 = 0; histogram_length != sVar2; sVar2 = sVar2 + 1) {
    if (histogram[sVar2] != 0) {
      if (uVar12 < 4) {
        s4[uVar12] = sVar2;
      }
      else if (uVar12 != 4) break;
      uVar12 = uVar12 + 1;
    }
  }
  lVar4 = 5;
  lVar5 = 4;
  lVar9 = lVar5;
  lVar11 = lVar5;
  for (uVar3 = alphabet_size - 1; uVar3 != 0; uVar3 = uVar3 >> 1) {
    lVar4 = lVar4 + 4;
    lVar11 = lVar11 + 3;
    lVar5 = lVar5 + 2;
    lVar9 = lVar9 + 1;
  }
  if (uVar12 < 2) {
    uVar3 = *storage_ix;
    uVar12 = uVar3 + 4;
    *(ulong *)(storage + (uVar3 >> 3)) = (ulong)storage[uVar3 >> 3] | 1L << ((byte)uVar3 & 7);
    *storage_ix = uVar12;
    *(size_t *)(storage + (uVar12 >> 3)) = s4[0] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3]
    ;
    *storage_ix = lVar9 + uVar3;
    depth[s4[0]] = '\0';
    bits[s4[0]] = 0;
  }
  else {
    switchD_016d4fed::default(depth,0,histogram_length);
    duckdb_brotli::BrotliCreateHuffmanTree(histogram,histogram_length,0xf,tree,depth);
    duckdb_brotli::BrotliConvertBitDepthsToSymbols(depth,histogram_length,bits);
    if (4 < uVar12) {
      duckdb_brotli::BrotliStoreHuffmanTree(depth,histogram_length,tree,storage_ix,storage);
      return;
    }
    uVar1 = *storage_ix;
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
    uVar3 = uVar1 + 2;
    *storage_ix = uVar3;
    *(ulong *)(storage + (uVar3 >> 3)) =
         uVar12 - 1 << ((byte)uVar3 & 7) | (ulong)storage[uVar3 >> 3];
    uVar3 = uVar1 + 4;
    *storage_ix = uVar3;
    uVar7 = 0;
    while (uVar10 = uVar7, uVar10 != uVar12) {
      for (uVar6 = uVar10 + 1; uVar7 = uVar10 + 1, uVar6 < uVar12; uVar6 = uVar6 + 1) {
        sVar2 = s4[uVar6];
        if (depth[sVar2] < depth[s4[uVar10]]) {
          s4[uVar6] = s4[uVar10];
          s4[uVar10] = sVar2;
        }
      }
    }
    uVar7 = s4[0] << ((byte)uVar3 & 7);
    uVar3 = uVar3 >> 3;
    uVar10 = lVar9 + uVar1;
    bVar8 = (byte)uVar10;
    if (uVar12 == 3) {
      *(ulong *)(storage + uVar3) = uVar7 | storage[uVar3];
      *storage_ix = uVar10;
      *(size_t *)(storage + (uVar10 >> 3)) = s4[1] << (bVar8 & 7) | (ulong)storage[uVar10 >> 3];
      uVar12 = lVar5 + uVar1;
      *storage_ix = uVar12;
      *(size_t *)(storage + (uVar12 >> 3)) =
           s4[2] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      sVar2 = uVar1 + lVar11;
    }
    else if (uVar12 == 2) {
      *(ulong *)(storage + uVar3) = uVar7 | storage[uVar3];
      *storage_ix = uVar10;
      *(size_t *)(storage + (uVar10 >> 3)) = s4[1] << (bVar8 & 7) | (ulong)storage[uVar10 >> 3];
      sVar2 = uVar1 + lVar5;
    }
    else {
      *(ulong *)(storage + uVar3) = uVar7 | storage[uVar3];
      *storage_ix = uVar10;
      *(size_t *)(storage + (uVar10 >> 3)) = s4[1] << (bVar8 & 7) | (ulong)storage[uVar10 >> 3];
      uVar12 = lVar5 + uVar1;
      *storage_ix = uVar12;
      *(size_t *)(storage + (uVar12 >> 3)) =
           s4[2] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      uVar12 = lVar11 + uVar1;
      *storage_ix = uVar12;
      *(size_t *)(storage + (uVar12 >> 3)) =
           s4[3] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      uVar12 = (uVar1 + lVar4) - 1;
      sVar2 = uVar1 + lVar4;
      *storage_ix = uVar12;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)(depth[s4[0]] == '\x01') << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
    }
    *storage_ix = sVar2;
  }
  return;
}

Assistant:

static void BuildAndStoreHuffmanTree(const uint32_t* histogram,
                                     const size_t histogram_length,
                                     const size_t alphabet_size,
                                     HuffmanTree* tree,
                                     uint8_t* depth,
                                     uint16_t* bits,
                                     size_t* storage_ix,
                                     uint8_t* storage) {
  size_t count = 0;
  size_t s4[4] = { 0 };
  size_t i;
  size_t max_bits = 0;
  for (i = 0; i < histogram_length; i++) {
    if (histogram[i]) {
      if (count < 4) {
        s4[count] = i;
      } else if (count > 4) {
        break;
      }
      count++;
    }
  }

  {
    size_t max_bits_counter = alphabet_size - 1;
    while (max_bits_counter) {
      max_bits_counter >>= 1;
      ++max_bits;
    }
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, s4[0], storage_ix, storage);
    depth[s4[0]] = 0;
    bits[s4[0]] = 0;
    return;
  }

  memset(depth, 0, histogram_length * sizeof(depth[0]));
  BrotliCreateHuffmanTree(histogram, histogram_length, 15, tree, depth);
  BrotliConvertBitDepthsToSymbols(depth, histogram_length, bits);

  if (count <= 4) {
    StoreSimpleHuffmanTree(depth, s4, count, max_bits, storage_ix, storage);
  } else {
    BrotliStoreHuffmanTree(depth, histogram_length, tree, storage_ix, storage);
  }
}